

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

Reference<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
          (Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
           *this,CordRep **args)

{
  CordRep **ppCVar1;
  ulong uVar2;
  Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
  *pSVar3;
  ulong uVar4;
  size_type __n;
  CordRep **ppCStack_38;
  size_type sStack_30;
  
  uVar4 = *(ulong *)this;
  uVar2 = 2;
  if ((uVar4 & 1) != 0) {
    uVar2 = *(ulong *)(this + 0x10);
  }
  if (uVar4 >> 1 != uVar2) {
    if ((uVar4 & 1) == 0) {
      pSVar3 = this + 8;
    }
    else {
      pSVar3 = *(Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
                 **)(this + 8);
    }
    *(ValueType<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> *)
     (pSVar3 + (uVar4 >> 1) * 8) = *args;
    *(ulong *)this = uVar4 + 2;
    return (Reference<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>)
           (pSVar3 + (uVar4 >> 1) * 8);
  }
  uVar4 = *(ulong *)this;
  pSVar3 = *(Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
             **)(this + 8);
  ppCStack_38 = (CordRep **)0x0;
  sStack_30 = 0;
  __n = 4;
  if ((uVar4 & 1) != 0) {
    __n = *(long *)(this + 0x10) * 2;
  }
  ppCStack_38 = __gnu_cxx::new_allocator<absl::lts_20250127::cord_internal::CordRep_*>::allocate
                          ((new_allocator<absl::lts_20250127::cord_internal::CordRep_*> *)
                           &ppCStack_38,__n,(void *)0x0);
  uVar2 = uVar4 >> 1;
  ppCStack_38[uVar2] = *args;
  if (1 < uVar4) {
    if ((uVar4 & 1) == 0) {
      pSVar3 = this + 8;
    }
    uVar4 = 0;
    do {
      ppCStack_38[uVar4] = *(CordRep **)(pSVar3 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  ppCVar1 = ppCStack_38 + uVar2;
  uVar4 = *(ulong *)this;
  sStack_30 = __n;
  if ((uVar4 & 1) != 0) {
    operator_delete(*(void **)(this + 8),*(long *)(this + 0x10) << 3);
    uVar4 = *(ulong *)this;
  }
  *(CordRep ***)(this + 8) = ppCStack_38;
  *(size_type *)(this + 0x10) = sStack_30;
  *(ulong *)this = (uVar4 | 1) + 2;
  return ppCVar1;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }